

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_preserve_unknown_enum2.pb.cc
# Opt level: O1

void __thiscall proto2_preserve_unknown_enum_unittest::MyMessage::~MyMessage(MyMessage *this)

{
  InternalMetadata *this_00;
  ulong uVar1;
  LogMessageFatal local_20;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
  }
  uVar1 = this_00->ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    if ((this->field_0)._impl_._oneof_case_[0] != 0) {
      (this->field_0)._impl_._oneof_case_[0] = 0;
    }
    google::protobuf::RepeatedField<int>::~RepeatedField
              (&(this->field_0)._impl_.repeated_packed_unexpected_e_);
    google::protobuf::RepeatedField<int>::~RepeatedField(&(this->field_0)._impl_.repeated_packed_e_)
    ;
    google::protobuf::RepeatedField<int>::~RepeatedField(&(this->field_0)._impl_.repeated_e_);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/google/protobuf/unittest_preserve_unknown_enum2.pb.cc"
             ,0xda,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

MyMessage::~MyMessage() {
  // @@protoc_insertion_point(destructor:proto2_preserve_unknown_enum_unittest.MyMessage)
  SharedDtor(*this);
}